

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_operator.cpp
# Opt level: O1

bool __thiscall
duckdb::PhysicalOperator::CanSaturateThreads(PhysicalOperator *this,ClientContext *context)

{
  int32_t val;
  TaskScheduler *this_00;
  unsigned_long uVar1;
  idx_t iVar2;
  
  this_00 = TaskScheduler::GetScheduler(context);
  val = TaskScheduler::NumberOfThreads(this_00);
  uVar1 = NumericCastImpl<unsigned_long,_int,_false>::Convert(val);
  iVar2 = EstimatedThreadCount(this);
  return uVar1 <= iVar2;
}

Assistant:

bool PhysicalOperator::CanSaturateThreads(ClientContext &context) const {
#ifdef DEBUG
	// In debug mode we always return true here so that the code that depends on it is well-tested
	return true;
#else
	const auto num_threads = NumericCast<idx_t>(TaskScheduler::GetScheduler(context).NumberOfThreads());
	return EstimatedThreadCount() >= num_threads;
#endif
}